

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

size_t multissl_version(char *buffer,size_t size)

{
  int iVar1;
  Curl_ssl *pCVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  Curl_ssl **ppCVar6;
  Curl_ssl *pCVar7;
  char *pcVar8;
  char *buffer_00;
  size_t __n;
  char vb [200];
  char local_f8 [200];
  
  pCVar2 = Curl_ssl;
  if (Curl_ssl == &Curl_ssl_multi) {
    pCVar2 = available_backends[0];
  }
  if (pCVar2 != multissl_version::selected) {
    multissl_version::backends[0] = '\0';
    buffer_00 = multissl_version::backends;
    ppCVar6 = available_backends;
    pCVar7 = available_backends[0];
    multissl_version::selected = pCVar2;
    while (pCVar2 = multissl_version::selected, ppCVar6 = ppCVar6 + 1, pCVar7 != (Curl_ssl *)0x0) {
      sVar3 = (*pCVar7->version)(local_f8,200);
      if (sVar3 != 0) {
        pcVar5 = " ";
        if (-(long)buffer_00 == -0x8711c0) {
          pcVar5 = "";
        }
        pcVar8 = "(";
        if (pCVar2 == pCVar7) {
          pcVar8 = "";
        }
        pcVar4 = ")";
        if (pCVar2 == pCVar7) {
          pcVar4 = "";
        }
        iVar1 = curl_msnprintf(buffer_00,(long)&multissl_version::backends_len + -(long)buffer_00,
                               "%s%s%s%s",pcVar5,pcVar8,local_f8,pcVar4);
        buffer_00 = buffer_00 + iVar1;
      }
      pCVar7 = *ppCVar6;
    }
    multissl_version::backends_len = (size_t)(buffer_00 + -0x8711c0);
  }
  __n = multissl_version::backends_len;
  if (size == 0) {
    __n = 0;
  }
  else if (multissl_version::backends_len < size) {
    strcpy(buffer,multissl_version::backends);
  }
  else {
    __n = size - 1;
    strncpy(buffer,multissl_version::backends,__n);
    buffer[size - 1] = '\0';
  }
  return __n;
}

Assistant:

static size_t multissl_version(char *buffer, size_t size)
{
  static const struct Curl_ssl *selected;
  static char backends[200];
  static size_t backends_len;
  const struct Curl_ssl *current;

  current = Curl_ssl == &Curl_ssl_multi ? available_backends[0] : Curl_ssl;

  if(current != selected) {
    char *p = backends;
    char *end = backends + sizeof(backends);
    int i;

    selected = current;

    backends[0] = '\0';

    for(i = 0; available_backends[i]; ++i) {
      char vb[200];
      bool paren = (selected != available_backends[i]);

      if(available_backends[i]->version(vb, sizeof(vb))) {
        p += msnprintf(p, end - p, "%s%s%s%s", (p != backends ? " " : ""),
                       (paren ? "(" : ""), vb, (paren ? ")" : ""));
      }
    }

    backends_len = p - backends;
  }

  if(!size)
    return 0;

  if(size <= backends_len) {
    strncpy(buffer, backends, size - 1);
    buffer[size - 1] = '\0';
    return size - 1;
  }

  strcpy(buffer, backends);
  return backends_len;
}